

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  allocator<char> local_51;
  TGAImage image;
  string local_28;
  
  TGAImage::TGAImage(&image,300,300,3);
  line_attempt_5(-100,-100,500,500,&image,(TGAColor)0x4ffffffff);
  line_attempt_5(0x28,0x28,0x3c,0x104,&image,(TGAColor)0x4ffffffff);
  line_attempt_5(0x28,0x28,0x104,0x3c,&image,(TGAColor)0x4ffffffff);
  TGAImage::flip_vertically(&image);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"output.tga",&local_51);
  TGAImage::write_tga_file(&image,&local_28,true,true);
  std::__cxx11::string::~string((string *)&local_28);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&image);
  return 0;
}

Assistant:

int main()
{
    TGAImage image(300, 300, TGAImage::RGB);

    line_attempt_5(-100, -100, 500, 500, image, white);
    line_attempt_5(40, 40, 60, 260, image, white);
    line_attempt_5(40, 40, 260, 60, image, white);

    image.flip_vertically();  // i want to have the origin at the left bottom corner of the image
    image.write_tga_file("output.tga");
    return 0;
}